

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void print_loop_subtree(gen_ctx_t gen_ctx,loop_node_t_conflict root,int level,int bb_p)

{
  FILE *__s;
  int iVar1;
  loop_node_t root_00;
  
  if (-1 < level) {
    iVar1 = (~(level * 2 >> 0x1f) & level * 2 + 1U) + 1;
    do {
      fputc(0x20,(FILE *)gen_ctx->debug_file);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  if (root->bb != (bb_t)0x0) {
    if ((root->children).head == (loop_node_t)0x0) {
      fprintf((FILE *)gen_ctx->debug_file,"BB%-3lu (pressure: int=%d, fp=%d)",root->bb->index,
              (ulong)(uint)root->max_int_pressure,(ulong)(uint)root->max_fp_pressure);
      if ((root->bb != (bb_t)0x0) && ((root->u).preheader != (loop_node_t)0x0)) {
        fprintf((FILE *)gen_ctx->debug_file," (loop of the preheader - loop%lu)",
                (ulong)((root->u).preheader)->index);
      }
      fputc(10,(FILE *)gen_ctx->debug_file);
      return;
    }
    __assert_fail("(DLIST_loop_node_t_head (&(root->children))) == ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x5b4,"void print_loop_subtree(gen_ctx_t, loop_node_t, int, int)");
  }
  __s = (FILE *)(ulong)(uint)root->max_int_pressure;
  fprintf((FILE *)gen_ctx->debug_file,"Loop%3lu (pressure: int=%d, fp=%d)",(ulong)root->index,__s,
          (ulong)(uint)root->max_fp_pressure);
  if ((gen_ctx->curr_cfg->root_loop_node == root) || (root->entry == (loop_node_t)0x0)) {
    __s = (FILE *)gen_ctx->debug_file;
    fwrite(":\n",2,1,__s);
  }
  else {
    if ((root->bb == (bb_t)0x0) && ((root->u).preheader != (loop_node_t)0x0)) {
      fprintf((FILE *)gen_ctx->debug_file," (preheader - bb%lu)",((root->u).preheader)->bb->index);
    }
    fprintf((FILE *)gen_ctx->debug_file," (entry - bb%lu):\n",root->entry->bb->index);
  }
  root_00 = (root->children).head;
  if (root_00 != (loop_node_t)0x0) {
    do {
      print_loop_subtree(gen_ctx,root_00,level + 1,(int)__s);
      root_00 = (root_00->children_link).next;
    } while (root_00 != (loop_node_t)0x0);
  }
  return;
}

Assistant:

static void print_loop_subtree (gen_ctx_t gen_ctx, loop_node_t root, int level, int bb_p) {
  if (root->bb != NULL && !bb_p) return;
  for (int i = 0; i < 2 * level + 2; i++) fprintf (debug_file, " ");
  if (root->bb != NULL) {
    gen_assert (DLIST_HEAD (loop_node_t, root->children) == NULL);
    fprintf (debug_file, "BB%-3lu (pressure: int=%d, fp=%d)", (unsigned long) root->bb->index,
             root->max_int_pressure, root->max_fp_pressure);
    if (root->bb != NULL && root->u.preheader_loop != NULL)
      fprintf (debug_file, " (loop of the preheader - loop%lu)",
               (unsigned long) root->u.preheader_loop->index);
    fprintf (debug_file, "\n");
    return;
  }
  fprintf (debug_file, "Loop%3lu (pressure: int=%d, fp=%d)", (unsigned long) root->index,
           root->max_int_pressure, root->max_fp_pressure);
  if (curr_cfg->root_loop_node == root || root->entry == NULL)
    fprintf (debug_file, ":\n");
  else {
    if (root->bb == NULL && root->u.preheader != NULL)
      fprintf (debug_file, " (preheader - bb%lu)", (unsigned long) root->u.preheader->bb->index);
    fprintf (debug_file, " (entry - bb%lu):\n", (unsigned long) root->entry->bb->index);
  }
  for (loop_node_t node = DLIST_HEAD (loop_node_t, root->children); node != NULL;
       node = DLIST_NEXT (loop_node_t, node))
    print_loop_subtree (gen_ctx, node, level + 1, bb_p);
}